

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::ContentEncoding::ContentEncoding(ContentEncoding *this)

{
  this->encryption_entries_ = (ContentEncryption **)0x0;
  this->encryption_entries_end_ = (ContentEncryption **)0x0;
  this->compression_entries_ = (ContentCompression **)0x0;
  this->compression_entries_end_ = (ContentCompression **)0x0;
  this->encoding_order_ = 0;
  this->encoding_scope_ = 1;
  this->encoding_type_ = 0;
  return;
}

Assistant:

ContentEncoding::ContentEncoding()
    : compression_entries_(NULL),
      compression_entries_end_(NULL),
      encryption_entries_(NULL),
      encryption_entries_end_(NULL),
      encoding_order_(0),
      encoding_scope_(1),
      encoding_type_(0) {}